

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O2

int IDAGetNumResEvalsSens(void *ida_mem,long *nrevalsS)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x7bd;
  }
  else {
    if (*(int *)((long)ida_mem + 0x9c) != 0) {
      *nrevalsS = *(long *)((long)ida_mem + 0x5e0);
      return 0;
    }
    msgfmt = "Illegal attempt to call before calling IDASensInit.";
    error_code = -0x28;
    line = 0x7c5;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDAGetNumResEvalsSens",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDAGetNumResEvalsSens(void* ida_mem, long int* nrevalsS)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_sensi == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_NO_SENS);
  }

  *nrevalsS = IDA_mem->ida_nreS;

  return (IDA_SUCCESS);
}